

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

DynamicType *
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
InternalCreateTypeForNewScObject<true>
          (ScriptContext *scriptContext,DynamicType *type,PropertyIdArray *propIds,bool shareType)

{
  uint initialCapacity;
  int propertyId;
  DynamicTypeHandler *pDVar1;
  code *pcVar2;
  bool bVar3;
  PropertyAttributes attributes;
  undefined4 *puVar4;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this;
  PropertyRecord *propertyKey;
  Recycler *pRVar5;
  DynamicType *this_00;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_80 [8];
  TrackAllocData data;
  
  pRVar5 = scriptContext->recycler;
  initialCapacity = propIds->count;
  uVar7 = (ulong)initialCapacity;
  data._32_8_ = propIds;
  if (0x3fffffff < uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x166,"(count <= static_cast<uint>(MaxPropertyIndexSize))",
                                "count <= static_cast<uint>(MaxPropertyIndexSize)");
    if (!bVar3) goto LAB_00df9743;
    *puVar4 = 0;
  }
  pDVar1 = (type->typeHandler).ptr;
  this = New(pRVar5,initialCapacity,pDVar1->inlineSlotCapacity,pDVar1->offsetOfInlineSlots,true,
             shareType);
  if (!shareType) {
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,'\b');
  }
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      propertyId = *(int *)(data._32_8_ + 8 + uVar6 * 4);
      if (propertyId == -1) {
        propertyKey = (PropertyRecord *)0x0;
      }
      else {
        propertyKey = ScriptContext::GetPropertyName(scriptContext,propertyId);
      }
      attributes = PropertyRecord::DefaultAttributesForPropertyId(propertyId,true);
      SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
      Add<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)this,
                 propertyKey,attributes,shareType,false,false,scriptContext);
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x179,"((typeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "(typeHandler->GetFlags() & IsPrototypeFlag) == 0");
    if (!bVar3) {
LAB_00df9743:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  scriptContext->objectLiteralSimpleDictionaryCount =
       scriptContext->objectLiteralSimpleDictionaryCount + 1;
  local_80 = (undefined1  [8])&DynamicType::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ee0091;
  data.filename._0_4_ = 0x17f;
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_80);
  this_00 = (DynamicType *)new<Memory::Recycler>(0x38,pRVar5,0x387914);
  DynamicType::DynamicType(this_00,type,&this->super_DynamicTypeHandler,true,shareType);
  return this_00;
}

Assistant:

DynamicType* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::InternalCreateTypeForNewScObject(ScriptContext* scriptContext, DynamicType* type, const Js::PropertyIdArray *propIds, bool shareType)
    {
        Recycler* recycler = scriptContext->GetRecycler();
        uint count = propIds->count;
        Assert(count <= static_cast<uint>(MaxPropertyIndexSize));

        SimpleDictionaryTypeHandlerBase* typeHandler = SimpleDictionaryTypeHandlerBase::New(recycler, count,
            type->GetTypeHandler()->GetInlineSlotCapacity(), type->GetTypeHandler()->GetOffsetOfInlineSlots(), true, shareType);
        if (!shareType) typeHandler->SetMayBecomeShared();

        for (uint i = 0; i < count; i++)
        {
            //
            // For a function with same named parameters,
            // property id Constants::NoProperty will be passed for all the dupes except the last one
            // We need to allocate space for dupes, but don't add those to map
            //
            PropertyId propertyId = propIds->elements[i];
            const PropertyRecord* propertyRecord = propertyId == Constants::NoProperty ? NULL : scriptContext->GetPropertyName(propertyId);
            PropertyAttributes attr = PropertyRecord::DefaultAttributesForPropertyId(propertyId, check__proto__);
            typeHandler->Add(propertyRecord, attr, shareType, false, false, scriptContext);
        }

        Assert((typeHandler->GetFlags() & IsPrototypeFlag) == 0);

#ifdef PROFILE_OBJECT_LITERALS
        scriptContext->objectLiteralSimpleDictionaryCount++;
#endif

        return RecyclerNew(recycler, DynamicType, type, typeHandler, /* isLocked = */ true, /* isShared = */ shareType);
    }